

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int depth;
  int iVar14;
  byte *pbVar15;
  stbi_uc *psVar16;
  byte *pbVar17;
  char *pcVar18;
  stbi_uc *psVar19;
  size_t __n;
  uint uVar20;
  int *piVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  stbi_uc *psVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  stbi__uint16 *tc_00;
  ulong uVar30;
  stbi__png *z_00;
  stbi__uint32 raw_len_00;
  int out_n;
  long lVar31;
  ulong uVar32;
  long *in_FS_OFFSET;
  ulong local_4d8;
  stbi_uc tc [3];
  ulong local_4b8;
  size_t local_480;
  stbi__uint32 raw_len;
  ulong local_458;
  stbi_uc *local_450;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar3 = true;
  bVar7 = 0;
  uVar12 = 0;
  bVar4 = false;
  local_4b8 = 0;
  local_480 = 0;
  local_4d8 = 0;
  bVar5 = false;
  bVar27 = 0;
LAB_00142528:
  iVar8 = stbi__get16be(s);
  uVar9 = stbi__get16be(s);
  uVar28 = iVar8 * 0x10000 + uVar9;
  uVar10 = stbi__get16be(s);
  uVar11 = stbi__get16be(s);
  uVar23 = uVar10 << 0x10 | uVar11;
  uVar24 = (uint)local_4d8;
  if ((int)uVar23 < 0x49484452) {
    if (uVar23 == 0x43674249) {
      bVar4 = true;
LAB_00142888:
      stbi__skip(s,uVar28);
      goto LAB_00142899;
    }
    if (uVar23 != 0x49444154) {
      if (uVar23 != 0x49454e44) goto LAB_0014286d;
      if (bVar3) goto LAB_00142bbd;
      if (scan != 0) {
        return 1;
      }
      if (*ppsVar1 == (stbi_uc *)0x0) {
        pcVar18 = "no IDAT";
        goto LAB_00142bc4;
      }
      raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
      psVar16 = (stbi_uc *)
                stbi_zlib_decode_malloc_guesssize_headerflag
                          ((char *)*ppsVar1,uVar24,raw_len,(int *)&raw_len,(uint)!bVar4);
      z->expanded = psVar16;
      if (psVar16 == (stbi_uc *)0x0) {
        return 0;
      }
      free(z->idata);
      raw_len_00 = raw_len;
      z->idata = (stbi_uc *)0x0;
      iVar8 = s->img_n + 1;
      iVar13 = s->img_n;
      if (bVar5) {
        iVar13 = iVar8;
      }
      out_n = iVar13;
      if (req_comp != 3) {
        out_n = iVar8;
      }
      if (bVar27 != 0) {
        out_n = iVar13;
      }
      if (iVar8 != req_comp) {
        out_n = iVar13;
      }
      s->img_out_n = out_n;
      psVar16 = z->expanded;
      uVar24 = z->depth;
      local_458 = (ulong)uVar24;
      iVar8 = out_n << (uVar24 == 0x10);
      x = z->s->img_x;
      y = z->s->img_y;
      if (bVar7 == 0) {
        iVar8 = stbi__create_png_image_raw(z,psVar16,raw_len,out_n,x,y,uVar24,uVar12);
        if (iVar8 == 0) {
          return 0;
        }
      }
      else {
        psVar19 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar8,0);
        if (psVar19 == (stbi_uc *)0x0) goto LAB_00143149;
        __n = (size_t)iVar8;
        lVar25 = 0;
        local_450 = psVar16;
        do {
          psVar2 = z->s;
          uVar24 = (&DAT_002991a0)[lVar25];
          uVar9 = (&DAT_002991e0)[lVar25];
          uVar29 = ~uVar24 + psVar2->img_x + uVar9;
          uVar23 = uVar29 / uVar9;
          uVar10 = (&DAT_002991c0)[lVar25];
          uVar11 = (&DAT_00299200)[lVar25];
          uVar20 = ~uVar10 + psVar2->img_y + uVar11;
          uVar28 = uVar20 / uVar11;
          if ((uVar9 <= uVar29) && (uVar11 <= uVar20)) {
            depth = (int)local_458;
            iVar13 = psVar2->img_n;
            iVar14 = stbi__create_png_image_raw
                               (z,local_450,raw_len_00,out_n,uVar23,uVar28,depth,uVar12);
            if (iVar14 == 0) {
              free(psVar19);
              return 0;
            }
            if (0 < (int)uVar28) {
              iVar14 = uVar10 * iVar8;
              local_4b8 = 0;
              do {
                if (0 < (int)uVar23) {
                  psVar16 = z->out;
                  psVar26 = psVar19 + (ulong)(z->s->img_x * iVar14) + (long)(int)uVar24 * __n;
                  lVar31 = 0;
                  do {
                    memcpy(psVar26,psVar16 + (local_4b8 * (long)(int)uVar23 + lVar31) * __n,__n);
                    lVar31 = lVar31 + 1;
                    psVar26 = psVar26 + (long)(int)uVar9 * __n;
                  } while (lVar31 < (int)uVar23);
                }
                local_4b8 = local_4b8 + 1;
                iVar14 = iVar14 + uVar11 * iVar8;
              } while (local_4b8 < uVar28);
            }
            uVar28 = (((int)(uVar23 * depth * iVar13 + 7) >> 3) + 1) * uVar28;
            free(z->out);
            local_450 = local_450 + uVar28;
            raw_len_00 = raw_len_00 - uVar28;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 7);
        z->out = psVar19;
      }
      if (bVar5) {
        z_00 = (stbi__png *)(ulong)z->s->img_x;
        tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
        iVar8 = (int)z->out;
        if (z->depth == 0x10) {
          stbi__compute_transparency16(z_00,tc_00,iVar8);
        }
        else {
          stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar8);
        }
      }
      if (bVar4) {
        piVar21 = &stbi__de_iphone_flag_global;
        if (*(int *)((long)in_FS_OFFSET + -0x14) != 0) {
          piVar21 = (int *)(*in_FS_OFFSET + -0x18);
        }
        if ((*piVar21 != 0) && (2 < s->img_out_n)) {
          stbi__de_iphone((stbi__png *)z->s);
        }
      }
      if (bVar27 == 0) {
        if (bVar5) {
          s->img_n = s->img_n + 1;
        }
      }
      else {
        s->img_n = (uint)bVar27;
        uVar12 = (uint)bVar27;
        if (2 < req_comp) {
          uVar12 = req_comp;
        }
        s->img_out_n = uVar12;
        psVar16 = z->out;
        uVar24 = z->s->img_y * z->s->img_x;
        psVar19 = (stbi_uc *)stbi__malloc_mad2(uVar24,uVar12,0);
        if (psVar19 == (stbi_uc *)0x0) {
LAB_00143149:
          in_FS_OFFSET[-6] = (long)"outofmem";
          return 0;
        }
        if (uVar12 == 3) {
          if (uVar24 != 0) {
            uVar32 = 0;
            psVar26 = psVar19;
            do {
              uVar30 = (ulong)psVar16[uVar32];
              *psVar26 = palette[uVar30 * 4];
              psVar26[1] = palette[uVar30 * 4 + 1];
              psVar26[2] = palette[uVar30 * 4 + 2];
              psVar26 = psVar26 + 3;
              uVar32 = uVar32 + 1;
            } while (uVar24 != uVar32);
          }
        }
        else if (uVar24 != 0) {
          uVar32 = 0;
          do {
            *(undefined4 *)(psVar19 + uVar32 * 4) =
                 *(undefined4 *)(palette + (ulong)psVar16[uVar32] * 4);
            uVar32 = uVar32 + 1;
          } while (uVar24 != uVar32);
        }
        free(psVar16);
        z->out = psVar19;
      }
      free(z->expanded);
      z->expanded = (stbi_uc *)0x0;
      stbi__get16be(s);
      stbi__get16be(s);
      return 1;
    }
    if (!bVar3) {
      if ((bVar27 == 0) || ((uint)local_4b8 != 0)) {
        if (scan == 2) {
          s->img_n = (uint)bVar27;
          return 1;
        }
        uVar9 = uVar28 + uVar24;
        if ((int)uVar9 < (int)uVar24) {
          return 0;
        }
        if ((uint)local_480 < uVar9) {
          uVar24 = 0x1000;
          if (0x1000 < uVar28) {
            uVar24 = uVar28;
          }
          uVar32 = (ulong)uVar24;
          if ((uint)local_480 != 0) {
            uVar32 = local_480;
          }
          do {
            local_480 = uVar32;
            uVar32 = (ulong)((uint)local_480 * 2);
          } while ((uint)local_480 < uVar9);
          psVar16 = (stbi_uc *)realloc(*ppsVar1,local_480);
          if (psVar16 == (stbi_uc *)0x0) goto LAB_00143149;
          *ppsVar1 = psVar16;
        }
        else {
          psVar16 = *ppsVar1;
        }
        iVar8 = stbi__getn(s,psVar16 + local_4d8,uVar28);
        bVar3 = false;
        uVar24 = uVar9;
        if (iVar8 != 0) goto LAB_00142899;
        pcVar18 = "outofdata";
      }
      else {
        pcVar18 = "no PLTE";
      }
      goto LAB_00142bc4;
    }
  }
  else {
    if (uVar23 == 0x74524e53) {
      if (bVar3) goto LAB_00142bbd;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        pcVar18 = "tRNS after IDAT";
        goto LAB_00142bc4;
      }
      if (bVar27 == 0) {
        uVar9 = s->img_n;
        if ((uVar9 & 1) == 0) {
          pcVar18 = "tRNS with alpha";
          goto LAB_00142bc4;
        }
        if (uVar9 * 2 != uVar28) {
LAB_00142c3f:
          pcVar18 = "bad tRNS len";
          goto LAB_00142bc4;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar9) {
            lVar25 = 0;
            do {
              iVar8 = stbi__get16be(s);
              tc16[lVar25] = (stbi__uint16)iVar8;
              lVar25 = lVar25 + 1;
            } while (lVar25 < s->img_n);
          }
        }
        else if (0 < (int)uVar9) {
          lVar25 = 0;
          do {
            iVar8 = stbi__get16be(s);
            tc[lVar25] = ""[z->depth] * (char)iVar8;
            lVar25 = lVar25 + 1;
          } while (lVar25 < s->img_n);
        }
        bVar5 = true;
        bVar3 = false;
        bVar27 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if ((uint)local_4b8 == 0) {
          pcVar18 = "tRNS before PLTE";
          goto LAB_00142bc4;
        }
        if ((uint)local_4b8 < uVar28) goto LAB_00142c3f;
        bVar27 = 4;
        if (uVar28 == 0) goto LAB_00142846;
        bVar3 = false;
        psVar16 = s->img_buffer;
        uVar32 = 0;
        do {
          if (psVar16 < s->img_buffer_end) {
LAB_001427ea:
            s->img_buffer = psVar16 + 1;
            sVar6 = *psVar16;
            psVar16 = psVar16 + 1;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar16 = s->img_buffer;
              goto LAB_001427ea;
            }
            sVar6 = '\0';
          }
          palette[uVar32 * 4 + 3] = sVar6;
          uVar32 = uVar32 + 1;
        } while (uVar9 + iVar8 * 0x10000 != uVar32);
      }
LAB_00142899:
      stbi__get16be(s);
      stbi__get16be(s);
      local_4d8 = (ulong)uVar24;
      goto LAB_00142528;
    }
    if (uVar23 == 0x504c5445) {
      if (!bVar3) {
        if ((uVar28 < 0x301) &&
           (uVar10 = uVar9 * 0xaaab >> 0x11, local_4b8 = (ulong)uVar10, uVar10 * 3 == uVar28)) {
          if (uVar9 < 3) {
LAB_00142846:
            bVar3 = false;
          }
          else {
            bVar3 = false;
            psVar16 = s->img_buffer;
            uVar32 = 0;
            do {
              psVar19 = s->img_buffer_end;
              if (psVar16 < psVar19) {
LAB_001428f8:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  psVar19 = s->img_buffer_end;
                  goto LAB_001428f8;
                }
                sVar6 = '\0';
              }
              palette[uVar32 * 4] = sVar6;
              if (psVar16 < psVar19) {
LAB_00142936:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  psVar19 = s->img_buffer_end;
                  goto LAB_00142936;
                }
                sVar6 = '\0';
              }
              palette[uVar32 * 4 + 1] = sVar6;
              if (psVar16 < psVar19) {
LAB_00142969:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  goto LAB_00142969;
                }
                sVar6 = '\0';
              }
              palette[uVar32 * 4 + 2] = sVar6;
              palette[uVar32 * 4 + 3] = 0xff;
              uVar32 = uVar32 + 1;
            } while (local_4b8 != uVar32);
          }
          goto LAB_00142899;
        }
        pcVar18 = "invalid PLTE";
        goto LAB_00142bc4;
      }
    }
    else {
      if (uVar23 == 0x49484452) {
        if (!bVar3) {
          pcVar18 = "multiple IHDR";
          goto LAB_00142bc4;
        }
        if (uVar28 != 0xd) {
          pcVar18 = "bad IHDR len";
          goto LAB_00142bc4;
        }
        iVar8 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        s->img_x = uVar12 | iVar8 << 0x10;
        iVar8 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar12 = uVar12 | iVar8 << 0x10;
        s->img_y = uVar12;
        if ((0x1000000 < uVar12) || (0x1000000 < s->img_x)) {
LAB_00142b91:
          pcVar18 = "too large";
LAB_00142bc4:
          in_FS_OFFSET[-6] = (long)pcVar18;
          return 0;
        }
        pbVar15 = s->img_buffer;
        if (pbVar15 < s->img_buffer_end) {
LAB_00142623:
          pbVar17 = pbVar15 + 1;
          s->img_buffer = pbVar17;
          bVar7 = *pbVar15;
          z->depth = (uint)bVar7;
          if ((bVar7 < 0x11) && ((0x10116U >> (bVar7 & 0x1f) & 1) != 0)) {
            if (s->img_buffer_end <= pbVar17) {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar17 = s->img_buffer;
                goto LAB_00142673;
              }
              bVar22 = 0;
              uVar12 = 0;
              goto LAB_00142a97;
            }
LAB_00142673:
            pbVar15 = pbVar17 + 1;
            s->img_buffer = pbVar15;
            bVar22 = *pbVar17;
            uVar12 = (uint)bVar22;
            if (6 < uVar12) {
LAB_00142bac:
              pcVar18 = "bad ctype";
              goto LAB_00142bc4;
            }
            pbVar17 = pbVar15;
            if (bVar22 == 3) {
              if (z->depth == 0x10) goto LAB_00142bac;
              uVar12 = 3;
              bVar22 = 3;
              bVar27 = 3;
            }
            else if ((bVar22 & 1) != 0) goto LAB_00142bac;
LAB_00142a97:
            if (pbVar17 < s->img_buffer_end) {
LAB_00142ab6:
              s->img_buffer = pbVar17 + 1;
              if (*pbVar17 != 0) {
                pcVar18 = "bad comp method";
                goto LAB_00142bc4;
              }
            }
            else if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar17 = s->img_buffer;
              goto LAB_00142ab6;
            }
            sVar6 = stbi__get8(s);
            if (sVar6 != '\0') {
              pcVar18 = "bad filter method";
              goto LAB_00142bc4;
            }
            bVar7 = stbi__get8(s);
            if (1 < bVar7) {
              pcVar18 = "bad interlace method";
              goto LAB_00142bc4;
            }
            uVar9 = s->img_x;
            if ((uVar9 == 0) || (uVar10 = s->img_y, uVar10 == 0)) {
              pcVar18 = "0-pixel image";
              goto LAB_00142bc4;
            }
            if (bVar27 != 0) {
              s->img_n = 1;
              bVar3 = false;
              if (uVar10 <= (uint)(0x40000000 / (ulong)uVar9 >> 2)) goto LAB_00142899;
              goto LAB_00142b91;
            }
            uVar11 = (uint)(3 < bVar22) + (uVar12 & 2) + 1;
            s->img_n = uVar11;
            if ((uint)((0x40000000 / (ulong)uVar9) / (ulong)uVar11) < uVar10) goto LAB_00142b91;
            bVar3 = false;
            bVar27 = 0;
            if (scan == 2) {
              return 1;
            }
            goto LAB_00142899;
          }
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar15 = s->img_buffer;
            goto LAB_00142623;
          }
          z->depth = 0;
        }
        pcVar18 = "1/2/4/8/16-bit only";
        goto LAB_00142bc4;
      }
LAB_0014286d:
      if (!bVar3) {
        bVar3 = false;
        if ((uVar10 >> 0xd & 1) == 0) {
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar10 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar10;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar11 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar11;
          in_FS_OFFSET[-6] = (long)stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_00142888;
      }
    }
  }
LAB_00142bbd:
  pcVar18 = "first not IHDR";
  goto LAB_00142bc4;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}